

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

unique_ptr<Catch::ColourImpl> Catch::makeColourImpl(ColourMode colourSelection,IStream *stream)

{
  bool bVar1;
  ReusableStringStream *pRVar2;
  char in_SIL;
  ColourImpl *in_RDI;
  unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl> *in_stack_ffffffffffffff38;
  IStream *in_stack_ffffffffffffff40;
  IStream **in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  ReusableStringStream local_78 [3];
  IStream *local_40 [8];
  
  if (in_SIL == '\x01') {
    Detail::make_unique<Catch::(anonymous_namespace)::ANSIColourImpl,Catch::IStream*&>
              (in_stack_ffffffffffffff58);
    Detail::unique_ptr<Catch::ColourImpl>::
    unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl,void>
              ((unique_ptr<Catch::ColourImpl> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
    ;
    Detail::unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl>::~unique_ptr
              ((unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl> *)in_stack_ffffffffffffff40
              );
  }
  else if (in_SIL == '\x03') {
    Detail::make_unique<Catch::(anonymous_namespace)::NoColourImpl,Catch::IStream*&>
              (in_stack_ffffffffffffff58);
    Detail::unique_ptr<Catch::ColourImpl>::
    unique_ptr<Catch::(anonymous_namespace)::NoColourImpl,void>
              ((unique_ptr<Catch::ColourImpl> *)in_stack_ffffffffffffff40,
               (unique_ptr<Catch::(anonymous_namespace)::NoColourImpl> *)in_stack_ffffffffffffff38);
    Detail::unique_ptr<Catch::(anonymous_namespace)::NoColourImpl>::~unique_ptr
              ((unique_ptr<Catch::(anonymous_namespace)::NoColourImpl> *)in_stack_ffffffffffffff40);
  }
  else {
    if (in_SIL != '\0') {
      pRVar2 = local_78;
      ReusableStringStream::ReusableStringStream(pRVar2);
      ReusableStringStream::operator<<(pRVar2,(char (*) [44])in_stack_ffffffffffffff38);
      pRVar2 = ReusableStringStream::operator<<(pRVar2,(int *)in_stack_ffffffffffffff38);
      ReusableStringStream::str_abi_cxx11_(pRVar2);
      throw_domain_error(in_stack_ffffffffffffff60);
    }
    bVar1 = anon_unknown_26::ANSIColourImpl::useImplementationForStream(in_stack_ffffffffffffff40);
    if (bVar1) {
      Detail::make_unique<Catch::(anonymous_namespace)::ANSIColourImpl,Catch::IStream*&>(local_40);
      Detail::unique_ptr<Catch::ColourImpl>::
      unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl,void>
                ((unique_ptr<Catch::ColourImpl> *)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38);
      Detail::unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl>::~unique_ptr
                ((unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl> *)
                 in_stack_ffffffffffffff40);
    }
    else {
      Detail::make_unique<Catch::(anonymous_namespace)::NoColourImpl,Catch::IStream*&>
                (in_stack_ffffffffffffff58);
      Detail::unique_ptr<Catch::ColourImpl>::
      unique_ptr<Catch::(anonymous_namespace)::NoColourImpl,void>
                ((unique_ptr<Catch::ColourImpl> *)in_stack_ffffffffffffff40,
                 (unique_ptr<Catch::(anonymous_namespace)::NoColourImpl> *)in_stack_ffffffffffffff38
                );
      Detail::unique_ptr<Catch::(anonymous_namespace)::NoColourImpl>::~unique_ptr
                ((unique_ptr<Catch::(anonymous_namespace)::NoColourImpl> *)in_stack_ffffffffffffff40
                );
    }
  }
  return (unique_ptr<Catch::ColourImpl>)in_RDI;
}

Assistant:

Detail::unique_ptr<ColourImpl> makeColourImpl( ColourMode colourSelection,
                                                   IStream* stream ) {
#if defined( CATCH_CONFIG_COLOUR_WIN32 )
        if ( colourSelection == ColourMode::Win32 ) {
            return Detail::make_unique<Win32ColourImpl>( stream );
        }
#endif
        if ( colourSelection == ColourMode::ANSI ) {
            return Detail::make_unique<ANSIColourImpl>( stream );
        }
        if ( colourSelection == ColourMode::None ) {
            return Detail::make_unique<NoColourImpl>( stream );
        }

        if ( colourSelection == ColourMode::PlatformDefault) {
#if defined( CATCH_CONFIG_COLOUR_WIN32 )
            if ( Win32ColourImpl::useImplementationForStream( *stream ) ) {
                return Detail::make_unique<Win32ColourImpl>( stream );
            }
#endif
            if ( ANSIColourImpl::useImplementationForStream( *stream ) ) {
                return Detail::make_unique<ANSIColourImpl>( stream );
            }
            return Detail::make_unique<NoColourImpl>( stream );
        }

        CATCH_ERROR( "Could not create colour impl for selection " << static_cast<int>(colourSelection) );
    }